

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O3

void __thiscall QCursor::setShape(QCursor *this,CursorShape shape)

{
  QCursorData *pQVar1;
  QCursorData *pQVar2;
  
  QCursorData::initialize();
  if (shape < (DragMoveCursor|CrossCursor)) {
    pQVar2 = qt_cursorTable[shape];
  }
  else {
    pQVar2 = (QCursorData *)0x0;
  }
  if (pQVar2 == (QCursorData *)0x0) {
    pQVar2 = qt_cursorTable[0];
  }
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = this->d;
  if (pQVar1 != (QCursorData *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar1 = this->d;
      if (pQVar1 != (QCursorData *)0x0) {
        QCursorData::~QCursorData(pQVar1);
      }
      operator_delete(pQVar1,0x38);
    }
  }
  this->d = pQVar2;
  return;
}

Assistant:

void QCursor::setShape(Qt::CursorShape shape)
{
    QCursorData::initialize();
    QCursorData *c = uint(shape) <= Qt::LastCursor ? qt_cursorTable[shape] : nullptr;
    if (!c)
        c = qt_cursorTable[0];
    c->ref.ref();
    if (!d) {
        d = c;
    } else {
        if (!d->ref.deref())
            delete d;
        d = c;
    }
}